

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void nth_valueStepFunc(sqlite3_context *pCtx,int nArg,sqlite3_value **apArg)

{
  long lVar1;
  int iVar2;
  long *plVar3;
  undefined1 *puVar4;
  sqlite3_value *psVar5;
  double dVar6;
  double dVar7;
  
  if ((short)pCtx->pMem->flags < 0) {
    plVar3 = (long *)pCtx->pMem->z;
  }
  else {
    plVar3 = (long *)createAggContext(pCtx,0x10);
  }
  if (plVar3 != (long *)0x0) {
    iVar2 = sqlite3_value_numeric_type(apArg[1]);
    if (iVar2 == 2) {
      dVar6 = sqlite3VdbeRealValue(apArg[1]);
      puVar4 = (undefined1 *)(long)dVar6;
      dVar7 = (double)(long)puVar4;
      if (dVar6 != dVar7) {
        puVar4 = &DAT_aaaaaaaaaaaaaaaa;
      }
      if (NAN(dVar6) || NAN(dVar7)) {
        puVar4 = &DAT_aaaaaaaaaaaaaaaa;
      }
      if ((dVar6 != dVar7) || (NAN(dVar6) || NAN(dVar7))) goto LAB_001b521e;
    }
    else {
      if (iVar2 != 1) goto LAB_001b521e;
      puVar4 = (undefined1 *)sqlite3VdbeIntValue(apArg[1]);
    }
    if ((long)puVar4 < 1) {
LAB_001b521e:
      pCtx->isError = 1;
      sqlite3VdbeMemSetStr
                (pCtx->pOut,"second argument to nth_value must be a positive integer",-1,'\x01',
                 (_func_void_void_ptr *)0xffffffffffffffff);
      return;
    }
    lVar1 = *plVar3;
    *plVar3 = lVar1 + 1;
    if (puVar4 == (undefined1 *)(lVar1 + 1)) {
      psVar5 = sqlite3_value_dup(*apArg);
      plVar3[1] = (long)psVar5;
      if (psVar5 == (sqlite3_value *)0x0) {
        sqlite3_result_error_nomem(pCtx);
        return;
      }
    }
  }
  return;
}

Assistant:

static void nth_valueStepFunc(
  sqlite3_context *pCtx,
  int nArg,
  sqlite3_value **apArg
){
  struct NthValueCtx *p;
  p = (struct NthValueCtx*)sqlite3_aggregate_context(pCtx, sizeof(*p));
  if( p ){
    i64 iVal;
    switch( sqlite3_value_numeric_type(apArg[1]) ){
      case SQLITE_INTEGER:
        iVal = sqlite3_value_int64(apArg[1]);
        break;
      case SQLITE_FLOAT: {
        double fVal = sqlite3_value_double(apArg[1]);
        if( ((i64)fVal)!=fVal ) goto error_out;
        iVal = (i64)fVal;
        break;
      }
      default:
        goto error_out;
    }
    if( iVal<=0 ) goto error_out;

    p->nStep++;
    if( iVal==p->nStep ){
      p->pValue = sqlite3_value_dup(apArg[0]);
      if( !p->pValue ){
        sqlite3_result_error_nomem(pCtx);
      }
    }
  }
  UNUSED_PARAMETER(nArg);
  UNUSED_PARAMETER(apArg);
  return;

 error_out:
  sqlite3_result_error(
      pCtx, "second argument to nth_value must be a positive integer", -1
  );
}